

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

void mqtt_mq_clean(mqtt_message_queue *mq)

{
  void *__dest;
  uint8_t *__src;
  mqtt_queued_message *pmVar1;
  mqtt_queued_message *pmVar2;
  size_t sVar3;
  mqtt_queued_message *pmVar4;
  mqtt_queued_message *pmVar5;
  long lVar6;
  long *plVar7;
  size_t sVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  
  pmVar2 = (mqtt_queued_message *)mq->mem_end;
  lVar9 = -0x28;
  lVar6 = -(long)pmVar2;
  pmVar5 = pmVar2;
  do {
    lVar10 = lVar6;
    pmVar4 = pmVar5 + -1;
    if (pmVar4 < mq->queue_tail) goto LAB_001025c1;
    lVar9 = lVar9 + 0x28;
    pmVar1 = pmVar5 + -1;
    lVar6 = lVar10 + 0x28;
    pmVar5 = pmVar4;
  } while (pmVar1->state == MQTT_QUEUED_COMPLETE);
  if (pmVar4 < mq->queue_tail) {
LAB_001025c1:
    pmVar5 = (mqtt_queued_message *)mq->mem_start;
    mq->curr = (uint8_t *)pmVar5;
    mq->queue_tail = pmVar2;
  }
  else {
    if (lVar9 == 0) {
      return;
    }
    __dest = mq->mem_start;
    __src = pmVar4->start;
    __n = (long)mq->curr - (long)__src;
    memmove(__dest,__src,__n);
    mq->curr = (uint8_t *)(__n + (long)mq->mem_start);
    lVar10 = (long)&mq->queue_tail[1].start + lVar10;
    lVar6 = -lVar10 >> 3;
    memmove((void *)((long)mq->mem_end + lVar6 * -8 + -0x28),mq->queue_tail,0x28 - lVar10);
    plVar7 = (long *)mq->mem_end;
    pmVar2 = (mqtt_queued_message *)(plVar7 + (-5 - lVar6));
    mq->queue_tail = pmVar2;
    if (lVar10 < 1) {
      lVar6 = lVar6 * -0x3333333333333333 + 1;
      do {
        plVar7 = plVar7 + -5;
        *plVar7 = (long)__dest + (*plVar7 - (long)__src);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    pmVar5 = (mqtt_queued_message *)mq->curr;
  }
  sVar3 = (long)(pmVar2 + -1) - (long)pmVar5;
  sVar8 = 0;
  if (pmVar5 <= pmVar2 + -1 && sVar3 != 0) {
    sVar8 = sVar3;
  }
  mq->curr_sz = sVar8;
  return;
}

Assistant:

void mqtt_mq_clean(struct mqtt_message_queue *mq) {
    struct mqtt_queued_message *new_head;

    for(new_head = mqtt_mq_get(mq, 0); new_head >= mq->queue_tail; --new_head) {
        if (new_head->state != MQTT_QUEUED_COMPLETE) break;
    }
    
    /* check if everything can be removed */
    if (new_head < mq->queue_tail) {
        mq->curr = (uint8_t *)mq->mem_start;
        mq->queue_tail = (struct mqtt_queued_message *)mq->mem_end;
        mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
        return;
    } else if (new_head == mqtt_mq_get(mq, 0)) {
        /* do nothing */
        return;
    }

    /* move buffered data */
    {
        size_t n = (size_t) (mq->curr - new_head->start);
        size_t removing = (size_t) (new_head->start - (uint8_t*) mq->mem_start);
        memmove(mq->mem_start, new_head->start, n);
        mq->curr = (unsigned char*)mq->mem_start + n;
      

        /* move queue */
        {
            ssize_t new_tail_idx = new_head - mq->queue_tail;
            memmove(mqtt_mq_get(mq, new_tail_idx), mq->queue_tail, sizeof(struct mqtt_queued_message) * (size_t) ((new_tail_idx + 1)));
            mq->queue_tail = mqtt_mq_get(mq, new_tail_idx);
          
            {
                /* bump back start's */
                ssize_t i = 0;
                for(; i < new_tail_idx + 1; ++i) {
                    mqtt_mq_get(mq, i)->start -= removing;
                }
            }
        }
    }

    /* get curr_sz */
    mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
}